

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
kratos::Simulator::get_slice_index
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,Simulator *this,Var *var)

{
  byte bVar1;
  bool bVar2;
  VarType VVar3;
  unsigned_long *puVar4;
  optional<unsigned_long> oVar5;
  pair<unsigned_int,_unsigned_int> local_84;
  undefined4 local_7c;
  _Storage<unsigned_long,_true> local_78;
  optional<unsigned_long> index;
  Var *v;
  VarVarSlice *var_slice;
  uint local_48;
  uint local_44;
  uint32_t low;
  uint32_t high;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  result;
  VarSlice *slice;
  Var *var_local;
  Simulator *this_local;
  
  VVar3 = Var::type(var);
  if (VVar3 != Slice) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::vector(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  result.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)var;
  get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&low,this,(Var *)var[1].super_IRNode._vptr_IRNode);
  bVar1 = (**(code **)((long)*result.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x158))();
  if ((bVar1 & 1) == 0) {
    local_44 = result.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[0x4f].second;
    local_48 = result.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[0x4f].first;
  }
  else {
    index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ =
         VarVarSlice::sliced_var
                   ((VarVarSlice *)
                    result.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    oVar5 = get_value_(this,(Var *)index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                   super__Optional_payload_base<unsigned_long>._8_8_);
    local_78._M_value =
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    index.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar2 = std::optional::operator_cast_to_bool((optional *)&local_78);
    if (!bVar2) {
      memset(__return_storage_ptr__,0,0x18);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::vector(__return_storage_ptr__);
      goto LAB_003106aa;
    }
    puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_78);
    local_44 = (uint)*puVar4;
    puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_78);
    local_48 = (uint)*puVar4;
  }
  local_84 = std::make_pair<unsigned_int&,unsigned_int&>(&local_44,&local_48);
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&low,&local_84);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&low);
LAB_003106aa:
  local_7c = 1;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)&low);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<uint32_t, uint32_t>> Simulator::get_slice_index(const Var *var) const {
    if (var->type() != VarType::Slice) {
        return {};
    }
    const auto *slice = reinterpret_cast<const VarSlice *>(var);
    auto result = get_slice_index(slice->parent_var);
    uint32_t high, low;
    if (slice->sliced_by_var()) {
        const auto *var_slice = reinterpret_cast<const VarVarSlice *>(slice);
        auto *v = var_slice->sliced_var();
        auto index = get_value_(v);
        // the index variable is empty
        if (!index) {
            return {};
        }
        high = *index;
        low = *index;
    } else {
        high = slice->high;
        low = slice->low;
    }
    result.emplace_back(std::make_pair(high, low));
    return result;
}